

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

cTValue * lj_debug_frame(lua_State *L,int level,int *size)

{
  ulong uVar1;
  cTValue *pcVar2;
  cTValue *pcVar3;
  cTValue *pcVar4;
  cTValue *pcVar5;
  int iVar6;
  
  pcVar5 = (cTValue *)((L->stack).ptr64 + 8);
  pcVar3 = L->base + -1;
  if (pcVar5 < pcVar3) {
    iVar6 = (uint)((lua_State *)(L->base[-2].u64 & 0x7fffffffffff) == L) + level;
    pcVar2 = pcVar3;
    while (pcVar4 = pcVar3, iVar6 != 0) {
      level = iVar6 + -1;
      uVar1 = pcVar4->u64;
      if ((uVar1 & 3) == 0) {
        pcVar3 = pcVar4 + (-2 - (ulong)*(byte *)(uVar1 - 3));
      }
      else {
        if (((uint)uVar1 & 7) == 3) {
          level = iVar6;
        }
        pcVar3 = (cTValue *)((long)pcVar4 - (uVar1 & 0xfffffffffffffff8));
      }
      if (pcVar3 <= pcVar5) {
        pcVar4 = (cTValue *)0x0;
        goto LAB_0010c6bb;
      }
      iVar6 = level + (uint)((lua_State *)(pcVar3[-1].u64 & 0x7fffffffffff) == L);
      pcVar2 = pcVar4;
    }
    level = (int)((ulong)((long)pcVar2 - (long)pcVar4) >> 3);
  }
  else {
    pcVar4 = (cTValue *)0x0;
  }
LAB_0010c6bb:
  *size = level;
  return pcVar4;
}

Assistant:

cTValue *lj_debug_frame(lua_State *L, int level, int *size)
{
  cTValue *frame, *nextframe, *bot = tvref(L->stack)+LJ_FR2;
  /* Traverse frames backwards. */
  for (nextframe = frame = L->base-1; frame > bot; ) {
    if (frame_gc(frame) == obj2gco(L))
      level++;  /* Skip dummy frames. See lj_err_optype_call(). */
    if (level-- == 0) {
      *size = (int)(nextframe - frame);
      return frame;  /* Level found. */
    }
    nextframe = frame;
    if (frame_islua(frame)) {
      frame = frame_prevl(frame);
    } else {
      if (frame_isvarg(frame))
	level++;  /* Skip vararg pseudo-frame. */
      frame = frame_prevd(frame);
    }
  }
  *size = level;
  return NULL;  /* Level not found. */
}